

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O3

bool __thiscall
rapidjson::
Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::WriteBool(Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
            *this,bool b)

{
  long lVar1;
  char *pcVar2;
  char cVar3;
  undefined7 in_register_00000031;
  Stack<rapidjson::CrtAllocator> *this_00;
  char cVar4;
  char cVar5;
  
  this_00 = &this->os_->stack_;
  lVar1 = (long)this_00->stackEnd_ - (long)this_00->stackTop_;
  if ((int)CONCAT71(in_register_00000031,b) == 0) {
    if (lVar1 < 5) {
      internal::Stack<rapidjson::CrtAllocator>::Expand<char>(this_00,5);
      this_00 = &this->os_->stack_;
    }
    pcVar2 = internal::Stack<rapidjson::CrtAllocator>::PushUnsafe<char>(this_00,1);
    *pcVar2 = 'f';
    this_00 = &this->os_->stack_;
    cVar3 = 's';
    cVar4 = 'l';
    cVar5 = 'a';
  }
  else {
    cVar3 = 'u';
    cVar4 = 'r';
    cVar5 = 't';
    if (lVar1 < 4) {
      internal::Stack<rapidjson::CrtAllocator>::Expand<char>(this_00,4);
      this_00 = &this->os_->stack_;
    }
  }
  pcVar2 = internal::Stack<rapidjson::CrtAllocator>::PushUnsafe<char>(this_00,1);
  *pcVar2 = cVar5;
  pcVar2 = internal::Stack<rapidjson::CrtAllocator>::PushUnsafe<char>(&this->os_->stack_,1);
  *pcVar2 = cVar4;
  pcVar2 = internal::Stack<rapidjson::CrtAllocator>::PushUnsafe<char>(&this->os_->stack_,1);
  *pcVar2 = cVar3;
  pcVar2 = internal::Stack<rapidjson::CrtAllocator>::PushUnsafe<char>(&this->os_->stack_,1);
  *pcVar2 = 'e';
  return true;
}

Assistant:

bool WriteBool(bool b)  {
        if (b) {
            PutReserve(*os_, 4);
            PutUnsafe(*os_, 't'); PutUnsafe(*os_, 'r'); PutUnsafe(*os_, 'u'); PutUnsafe(*os_, 'e');
        }
        else {
            PutReserve(*os_, 5);
            PutUnsafe(*os_, 'f'); PutUnsafe(*os_, 'a'); PutUnsafe(*os_, 'l'); PutUnsafe(*os_, 's'); PutUnsafe(*os_, 'e');
        }
        return true;
    }